

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmorpher.cpp
# Opt level: O1

EffectProps * __thiscall
anon_unknown.dwarf_1a4727::VmorpherStateFactory::getDefaultProps
          (EffectProps *__return_storage_ptr__,VmorpherStateFactory *this)

{
  *(int *)__return_storage_ptr__ = 0;
  *(int *)((long)__return_storage_ptr__ + 4) = 0;
  *(float *)((long)__return_storage_ptr__ + 8) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0xc) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x10) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x14) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x18) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x1c) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x5c) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x60) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 100) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x68) = 0.0;
  *(undefined8 *)((__return_storage_ptr__->Reverb).LateReverbPan + 2) = 0;
  *(float *)((long)__return_storage_ptr__ + 0x58) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x5c) = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x3c))[1] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x3c))[2] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x48))[0] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x48))[1] = 0.0;
  *(bool *)((long)__return_storage_ptr__ + 0x30) = false;
  *(undefined3 *)((long)__return_storage_ptr__ + 0x31) = 0;
  *(float *)((long)__return_storage_ptr__ + 0x34) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x38) = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x3c))[0] = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x20) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x24) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x28) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x2c) = 0.0;
  (__return_storage_ptr__->Chorus).Waveform = 0x3fb47ae1;
  *(float *)((long)__return_storage_ptr__ + 4) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 8) = 1.4013e-44;
  *(float *)((long)__return_storage_ptr__ + 0xc) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 0x10) = 0.0;
  (__return_storage_ptr__->Reverb).DecayHFRatio = 0.0;
  return __return_storage_ptr__;
}

Assistant:

EffectProps VmorpherStateFactory::getDefaultProps() const noexcept
{
    EffectProps props{};
    props.Vmorpher.Rate                 = AL_VOCAL_MORPHER_DEFAULT_RATE;
    props.Vmorpher.PhonemeA             = AL_VOCAL_MORPHER_DEFAULT_PHONEMEA;
    props.Vmorpher.PhonemeB             = AL_VOCAL_MORPHER_DEFAULT_PHONEMEB;
    props.Vmorpher.PhonemeACoarseTuning = AL_VOCAL_MORPHER_DEFAULT_PHONEMEA_COARSE_TUNING;
    props.Vmorpher.PhonemeBCoarseTuning = AL_VOCAL_MORPHER_DEFAULT_PHONEMEB_COARSE_TUNING;
    props.Vmorpher.Waveform             = AL_VOCAL_MORPHER_DEFAULT_WAVEFORM;
    return props;
}